

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O1

uint8_t * __thiscall pktalloc::Allocator::Allocate(Allocator *this,uint bytes)

{
  uint bitEnd;
  uint count;
  WindowHeader *this_00;
  bool bVar1;
  uint uVar2;
  uint bitStart;
  uint uVar3;
  uint8_t *puVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint units;
  uint8_t *local_40;
  
  if (bytes == 0) {
    local_40 = (uint8_t *)0x0;
  }
  else {
    if (0x3fff < bytes + 0x1f) {
      puVar4 = fallbackAllocate(this,bytes);
      return puVar4;
    }
    uVar8 = bytes + 0x1f >> 5;
    units = uVar8 + 1;
    count = (this->PreferredWindows).Size;
    uVar2 = count - 1;
    uVar5 = uVar2 >> 0x1f;
    if (-1 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
      do {
        this_00 = (this->PreferredWindows).DataPtr[uVar7];
        iVar9 = 6;
        if (uVar8 < this_00->FreeUnitCount) {
          bitStart = this_00->ResumeScanOffset;
          do {
            iVar9 = 0;
            if (0x7ff < bitStart) goto LAB_00118f92;
            bitStart = CustomBitSet<2048U>::FindFirstClear(&this_00->Used,bitStart);
            bitEnd = bitStart + units;
            iVar6 = 10;
            if (bitEnd < 0x801) {
              uVar3 = CustomBitSet<2048U>::FindFirstSet(&this_00->Used,bitStart + 1,bitEnd);
              if (uVar8 < uVar3 - bitStart) {
                uVar3 = bitStart << 5;
                *(WindowHeader **)(&this_00[1].field_0x10 + uVar3) = this_00;
                *(uint *)(&this_00[1].field_0x18 + uVar3) = units;
                this_00->FreeUnitCount = this_00->FreeUnitCount - units;
                CustomBitSet<2048U>::SetRange(&this_00->Used,bitStart,bitEnd);
                this_00->ResumeScanOffset = bitEnd;
                moveLastFewWindowsToFull
                          (this,((uVar2 - (int)uVar7) + 1) - (uint)(bitStart + units * 2 < 0x801));
                local_40 = &this_00[1].field_0x30 + uVar3;
                iVar6 = 1;
              }
              else {
                bitStart = uVar3 + 1;
                iVar6 = 9;
              }
            }
          } while (iVar6 == 9);
          if (iVar6 != 10) {
            iVar9 = iVar6;
          }
        }
LAB_00118f92:
        if ((iVar9 != 6) && (iVar9 != 0)) break;
        uVar5 = (uint)((long)uVar7 < 1);
        bVar1 = 0 < (long)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar1);
    }
    if (uVar5 != 0) {
      moveLastFewWindowsToFull(this,count);
      puVar4 = allocateFromNewWindow(this,units);
      return puVar4;
    }
  }
  return local_40;
}

Assistant:

uint8_t* Allocator::Allocate(unsigned bytes)
{
    if (bytes <= 0) {
        return nullptr;
    }

    ALLOC_DEBUG_INTEGRITY_CHECK();

    // Calculate number of units required by this allocation
    // Note: +1 for the AllocationHeader
    const unsigned units = (bytes + kUnitSize - 1) / kUnitSize + 1;

    if (units > kFallbackThresholdUnits) {
        return fallbackAllocate(bytes);
    }

    // Check preferred windows list:
    const unsigned preferredCount = PreferredWindows.GetSize();
    for (int i = (int)preferredCount - 1; i >= 0; --i)
    {
        WindowHeader* window = PreferredWindows.GetRef(i);
        PKTALLOC_DEBUG_ASSERT(window);

        if (window->FreeUnitCount < units) {
            continue;
        }

        // Walk the holes in the bitmask:
        UsedMaskT* usedPtr = &window->Used;
        unsigned regionStart = window->ResumeScanOffset;
        while (regionStart < UsedMaskT::kValidBits)
        {
            regionStart = usedPtr->FindFirstClear(regionStart);
            unsigned regionEnd = regionStart + units;

            // If we ran out of space:
            if (regionEnd > UsedMaskT::kValidBits) {
                break;
            }

            regionEnd = usedPtr->FindFirstSet(regionStart + 1, regionEnd);
            PKTALLOC_DEBUG_ASSERT(regionEnd > regionStart);
            PKTALLOC_DEBUG_ASSERT(regionEnd <= UsedMaskT::kValidBits);

            if (regionEnd - regionStart < units)
            {
                regionStart = regionEnd + 1;
                continue;
            }
            regionEnd = regionStart + units;

            // Carve out region
            uint8_t* region = (uint8_t*)window + kWindowHeaderBytes + regionStart * kUnitSize;
            AllocationHeader* regionHeader = (AllocationHeader*)region;
#ifdef PKTALLOC_DEBUG
            regionHeader->Canary = AllocationHeader::kCanaryExpected;
#endif // PKTALLOC_DEBUG
            regionHeader->Header = window;
            regionHeader->UsedUnits = units;

            // Update window header
#ifdef PKTALLOC_SHRINK
            if (window->FreeUnitCount >= kWindowMaxUnits &&
                !window->Preallocated)
            {
                PKTALLOC_DEBUG_ASSERT(EmptyWindowCount > 0);
                --EmptyWindowCount;
            }
#endif // PKTALLOC_SHRINK
            window->FreeUnitCount -= units;
            usedPtr->SetRange(regionStart, regionStart + units);
            window->ResumeScanOffset = regionStart + units;

            // Any prior windows that failed to allocate are moved to full list
            unsigned fullCount = preferredCount - 1 - i;

            // Move this window to the full list if we cannot make another allocation of the same size
            if (regionStart + units * 2 > kWindowMaxUnits) {
                // Include this one too
                ++fullCount;
            }

            moveLastFewWindowsToFull(fullCount);

            uint8_t* data = region + kUnitSize;
#ifdef PKTALLOC_SCRUB_MEMORY
            memset(data, 0, (units - 1) * kUnitSize);
#endif // PKTALLOC_SCRUB_MEMORY
            PKTALLOC_DEBUG_ASSERT((uintptr_t)data % kUnitSize == 0);
            PKTALLOC_DEBUG_ASSERT((uint8_t*)regionHeader >= (uint8_t*)regionHeader->Header + kWindowHeaderBytes);
            PKTALLOC_DEBUG_ASSERT(regionHeader->GetUnitStart() < kWindowMaxUnits);
            PKTALLOC_DEBUG_ASSERT(regionHeader->GetUnitStart() + regionHeader->UsedUnits <= kWindowMaxUnits);
            return data;
        }
    }

    // Move all preferred windows to full since none of them worked out
    moveLastFewWindowsToFull(preferredCount);

    return allocateFromNewWindow(units);
}